

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

int twin_messenger_get_send_status
              (TWIN_MESSENGER_HANDLE twin_msgr_handle,TWIN_MESSENGER_SEND_STATUS *send_status)

{
  LIST_ITEM_HANDLE pLVar1;
  undefined4 local_34;
  TWIN_MESSENGER_HANDLE pTStack_30;
  TWIN_OPERATION_TYPE twin_op_type;
  TWIN_MESSENGER_INSTANCE_conflict *twin_msgr;
  LOGGER_LOG l;
  TWIN_MESSENGER_SEND_STATUS *pTStack_18;
  int result;
  TWIN_MESSENGER_SEND_STATUS *send_status_local;
  TWIN_MESSENGER_HANDLE twin_msgr_handle_local;
  
  pTStack_18 = send_status;
  send_status_local = (TWIN_MESSENGER_SEND_STATUS *)twin_msgr_handle;
  if ((twin_msgr_handle != (TWIN_MESSENGER_HANDLE)0x0) &&
     (send_status != (TWIN_MESSENGER_SEND_STATUS *)0x0)) {
    local_34 = 1;
    pTStack_30 = twin_msgr_handle;
    pLVar1 = singlylinkedlist_get_head_item(twin_msgr_handle->pending_patches);
    if ((pLVar1 == (LIST_ITEM_HANDLE)0x0) &&
       (pLVar1 = singlylinkedlist_find(pTStack_30->operations,find_twin_operation_by_type,&local_34)
       , pLVar1 == (LIST_ITEM_HANDLE)0x0)) {
      *pTStack_18 = TWIN_MESSENGER_SEND_STATUS_IDLE;
    }
    else {
      *pTStack_18 = TWIN_MESSENGER_SEND_STATUS_BUSY;
    }
    return 0;
  }
  twin_msgr = (TWIN_MESSENGER_INSTANCE_conflict *)xlogging_get_log_function();
  if (twin_msgr != (TWIN_MESSENGER_INSTANCE_conflict *)0x0) {
    (*(code *)twin_msgr)
              (0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
               ,"twin_messenger_get_send_status",0x789,1,
               "Invalid argument (twin_msgr_handle=%p, send_status=%p)",send_status_local,pTStack_18
              );
  }
  return 0x78a;
}

Assistant:

int twin_messenger_get_send_status(TWIN_MESSENGER_HANDLE twin_msgr_handle, TWIN_MESSENGER_SEND_STATUS* send_status)
{
    int result;

    if (twin_msgr_handle == NULL || send_status == NULL)
    {
        LogError("Invalid argument (twin_msgr_handle=%p, send_status=%p)", twin_msgr_handle, send_status);
        result = MU_FAILURE;
    }
    else
    {
        TWIN_MESSENGER_INSTANCE* twin_msgr = (TWIN_MESSENGER_INSTANCE*)twin_msgr_handle;
        TWIN_OPERATION_TYPE twin_op_type = TWIN_OPERATION_TYPE_PATCH;

        if (singlylinkedlist_get_head_item(twin_msgr->pending_patches) != NULL ||
            singlylinkedlist_find(twin_msgr->operations, find_twin_operation_by_type, &twin_op_type))
        {
            *send_status = TWIN_MESSENGER_SEND_STATUS_BUSY;
        }
        else
        {
            *send_status = TWIN_MESSENGER_SEND_STATUS_IDLE;
        }

        result = RESULT_OK;
    }

    return result;
}